

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffkshf(fitsfile *fptr,int colmin,int colmax,int incre,int *status)

{
  int iVar1;
  size_t sVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_R8;
  char newkey [75];
  char q [75];
  char rec [81];
  long ivalue;
  int i1;
  int tstatus;
  int nrec;
  int nmore;
  int nkeys;
  int *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  fitsfile *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  char local_e8 [16];
  int *in_stack_ffffffffffffff28;
  long *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char local_98 [88];
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_24;
  int *local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_20 = in_R8;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  ffghsp(in_stack_fffffffffffffed8,
         (int *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
         in_stack_fffffffffffffec8,(int *)0x130d51);
  for (local_2c = 9; local_2c <= local_24; local_2c = local_2c + 1) {
    ffgrec(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,(char *)in_stack_fffffffffffffec8,
           (int *)0x130d94);
    if (local_98[0] == 'T') {
      local_34 = 0;
      strncpy(local_e8,local_98 + 1,4);
      iVar1 = strncmp(local_e8,"BCOL",4);
      if (((((iVar1 == 0) || (iVar1 = strncmp(local_e8,"FORM",4), iVar1 == 0)) ||
           (iVar1 = strncmp(local_e8,"TYPE",4), iVar1 == 0)) ||
          (((iVar1 = strncmp(local_e8,"SCAL",4), iVar1 == 0 ||
            (iVar1 = strncmp(local_e8,"UNIT",4), iVar1 == 0)) ||
           ((iVar1 = strncmp(local_e8,"NULL",4), iVar1 == 0 ||
            ((iVar1 = strncmp(local_e8,"ZERO",4), iVar1 == 0 ||
             (iVar1 = strncmp(local_e8,"DISP",4), iVar1 == 0)))))))) ||
         ((iVar1 = strncmp(local_e8,"LMIN",4), iVar1 == 0 ||
          ((((((iVar1 = strncmp(local_e8,"LMAX",4), iVar1 == 0 ||
               (iVar1 = strncmp(local_e8,"DMIN",4), iVar1 == 0)) ||
              (iVar1 = strncmp(local_e8,"DMAX",4), iVar1 == 0)) ||
             ((iVar1 = strncmp(local_e8,"CTYP",4), iVar1 == 0 ||
              (iVar1 = strncmp(local_e8,"CRPX",4), iVar1 == 0)))) ||
            ((iVar1 = strncmp(local_e8,"CRVL",4), iVar1 == 0 ||
             ((iVar1 = strncmp(local_e8,"CDLT",4), iVar1 == 0 ||
              (iVar1 = strncmp(local_e8,"CROT",4), iVar1 == 0)))))) ||
           (iVar1 = strncmp(local_e8,"CUNI",4), iVar1 == 0)))))) {
        local_34 = 5;
      }
      else {
        iVar1 = strncmp(local_98,"TDIM",4);
        if (iVar1 == 0) {
          local_34 = 4;
        }
      }
      if (local_34 != 0) {
        local_e8[0] = '\0';
        strncat(local_e8,local_98 + local_34,(long)(8 - local_34));
        local_30 = 0;
        ffc2ii(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if (((local_30 == 0) && (local_c <= local_40)) && (local_40 <= local_10)) {
          if ((local_14 < 1) && (local_40 == local_c)) {
            ffdrec((fitsfile *)newkey._40_8_,newkey._36_4_,(int *)newkey._24_8_);
            local_24 = local_24 + -1;
            local_2c = local_2c + -1;
          }
          else {
            local_40 = local_40 + local_14;
            local_e8[0] = '\0';
            strncat(local_e8,local_98,(long)local_34);
            ffkeyn(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                   in_stack_fffffffffffffef0);
            strncpy(local_98,"        ",8);
            sVar2 = strlen(&stack0xfffffffffffffec8);
            local_34 = (int)sVar2;
            strncpy(local_98,&stack0xfffffffffffffec8,(long)local_34);
            ffmrec(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                   (char *)in_stack_fffffffffffffec8,(int *)0x1311e0);
          }
        }
      }
    }
  }
  return *local_20;
}

Assistant:

int ffkshf(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colmin,      /* I - starting col. to be incremented; 1 = 1st */
           int colmax,      /* I - last column to be incremented            */
           int incre,       /* I - shift index number by this amount        */
           int *status)     /* IO - error status                            */
/*
  shift the index value on any existing column keywords
  This routine will modify the name of any keyword that begins with 'T'
  and has an index number in the range COLMIN - COLMAX, inclusive.

  if incre is positive, then the index values will be incremented.
  if incre is negative, then the kewords with index = COLMIN
  will be deleted and the index of higher numbered keywords will
  be decremented.
*/
{
    int nkeys, nmore, nrec, tstatus, i1;
    long ivalue;
    char rec[FLEN_CARD], q[FLEN_KEYWORD], newkey[FLEN_KEYWORD];

    ffghsp(fptr, &nkeys, &nmore, status);  /* get number of keywords */

    /* go thru header starting with the 9th keyword looking for 'TxxxxNNN' */

    for (nrec = 9; nrec <= nkeys; nrec++)
    {     
        ffgrec(fptr, nrec, rec, status);

        if (rec[0] == 'T')
        {
            i1 = 0;
            strncpy(q, &rec[1], 4);
            if (!strncmp(q, "BCOL", 4) || !strncmp(q, "FORM", 4) ||
                !strncmp(q, "TYPE", 4) || !strncmp(q, "SCAL", 4) ||
                !strncmp(q, "UNIT", 4) || !strncmp(q, "NULL", 4) ||
                !strncmp(q, "ZERO", 4) || !strncmp(q, "DISP", 4) ||
                !strncmp(q, "LMIN", 4) || !strncmp(q, "LMAX", 4) ||
                !strncmp(q, "DMIN", 4) || !strncmp(q, "DMAX", 4) ||
                !strncmp(q, "CTYP", 4) || !strncmp(q, "CRPX", 4) ||
                !strncmp(q, "CRVL", 4) || !strncmp(q, "CDLT", 4) ||
                !strncmp(q, "CROT", 4) || !strncmp(q, "CUNI", 4) )
              i1 = 5;
            else if (!strncmp(rec, "TDIM", 4) )
              i1 = 4;

            if (i1)
            {
              /* try reading the index number suffix */
              q[0] = '\0';
              strncat(q, &rec[i1], 8 - i1);

              tstatus = 0;
              ffc2ii(q, &ivalue, &tstatus);

              if (tstatus == 0 && ivalue >= colmin && ivalue <= colmax)
              {
                if (incre <= 0 && ivalue == colmin)       
                {
                  ffdrec(fptr, nrec, status); /* delete keyword */
                  nkeys = nkeys - 1;
                  nrec = nrec - 1;
                }
                else
                {
                  ivalue = ivalue + incre;
                  q[0] = '\0';
                  strncat(q, rec, i1);
     
                  ffkeyn(q, ivalue, newkey, status);
		  /* NOTE: because of null termination, it is not 
		     equivalent to use strcpy() for the same calls */
                  strncpy(rec, "        ", 8);    /* erase old keyword name */
                  i1 = strlen(newkey);
                  strncpy(rec, newkey, i1);   /* overwrite new keyword name */
                  ffmrec(fptr, nrec, rec, status);  /* modify the record */
                }
              }
            }
        }
    }
    return(*status);
}